

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateType.cpp
# Opt level: O0

bool __thiscall DIS::AggregateType::operator==(AggregateType *this,AggregateType *rhs)

{
  bool local_19;
  bool ivarsEqual;
  AggregateType *rhs_local;
  AggregateType *this_local;
  
  local_19 = this->_domain == rhs->_domain && this->_aggregateKind == rhs->_aggregateKind;
  if (this->_country != rhs->_country) {
    local_19 = false;
  }
  if (this->_category != rhs->_category) {
    local_19 = false;
  }
  if (this->_subcategory != rhs->_subcategory) {
    local_19 = false;
  }
  if (this->_specific != rhs->_specific) {
    local_19 = false;
  }
  if (this->_extra != rhs->_extra) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool AggregateType::operator ==(const AggregateType& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_aggregateKind == rhs._aggregateKind) ) ivarsEqual = false;
     if( ! (_domain == rhs._domain) ) ivarsEqual = false;
     if( ! (_country == rhs._country) ) ivarsEqual = false;
     if( ! (_category == rhs._category) ) ivarsEqual = false;
     if( ! (_subcategory == rhs._subcategory) ) ivarsEqual = false;
     if( ! (_specific == rhs._specific) ) ivarsEqual = false;
     if( ! (_extra == rhs._extra) ) ivarsEqual = false;

    return ivarsEqual;
 }